

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

QByteArray * qStringAsUcs2Le(QByteArray *__return_storage_ptr__,QString *src)

{
  char16_t *pcVar1;
  long lVar2;
  char *pcVar3;
  QString *__range1;
  long lVar4;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(src->d).size * 2,'\0');
  pcVar3 = QByteArray::data(__return_storage_ptr__);
  pcVar1 = (src->d).ptr;
  lVar2 = (src->d).size;
  for (lVar4 = 0; lVar2 * 2 != lVar4; lVar4 = lVar4 + 2) {
    *(undefined2 *)(pcVar3 + lVar4) = *(undefined2 *)((long)pcVar1 + lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

static QByteArray qStringAsUcs2Le(const QString& src)
{
    QByteArray rc(2*src.size(), 0);
    unsigned short *d = (unsigned short*)rc.data();
    for (QChar ch : src)
        *d++ = qToLittleEndian(quint16(ch.unicode()));

    return rc;
}